

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::Constraint::visit<slang::ast::builtins::SequenceMethodExprVisitor>
          (Constraint *this,SequenceMethodExprVisitor *visitor)

{
  uint *in_RDI;
  
  (*(code *)(&DAT_00cb72a0 + *(int *)(&DAT_00cb72a0 + (ulong)*in_RDI * 4)))();
  return;
}

Assistant:

decltype(auto) Constraint::visit(TVisitor& visitor, Args&&... args) const {
    // clang-format off
#define CASE(k, n) case ConstraintKind::k: return visitor.visit(*static_cast<const n*>(this), std::forward<Args>(args)...)
    switch (kind) {
        CASE(Invalid, InvalidConstraint);
        CASE(List, ConstraintList);
        CASE(Expression, ExpressionConstraint);
        CASE(Implication, ImplicationConstraint);
        CASE(Conditional, ConditionalConstraint);
        CASE(Uniqueness, UniquenessConstraint);
        CASE(DisableSoft, DisableSoftConstraint);
        CASE(SolveBefore, SolveBeforeConstraint);
        CASE(Foreach, ForeachConstraint);
    }
#undef CASE
    // clang-format on
    SLANG_UNREACHABLE;
}